

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::EnhancedLayouts::XFBCaptureStructTest::getShaderSource_abi_cxx11_
          (string *__return_storage_ptr__,XFBCaptureStructTest *this,GLuint test_case_index,
          STAGES stage)

{
  TestError *this_00;
  string local_98;
  string local_78;
  string local_48;
  undefined1 local_21;
  STAGES local_20;
  GLuint local_1c;
  STAGES stage_local;
  GLuint test_case_index_local;
  XFBCaptureStructTest *this_local;
  string *source;
  
  local_21 = 0;
  local_20 = stage;
  local_1c = test_case_index;
  _stage_local = this;
  this_local = (XFBCaptureStructTest *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  if (local_1c == 0) {
    if ((local_20 | GEOMETRY) == FRAGMENT) {
      BufferTestBase::getShaderSource_abi_cxx11_(&local_48,&this->super_BufferTestBase,0,local_20);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_48);
      std::__cxx11::string::~string((string *)&local_48);
    }
  }
  else if (local_1c == 1) {
    if ((local_20 - VERTEX < 3) || (local_20 == FRAGMENT)) {
      BufferTestBase::getShaderSource_abi_cxx11_(&local_78,&this->super_BufferTestBase,1,local_20);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_78);
      std::__cxx11::string::~string((string *)&local_78);
    }
  }
  else {
    if (local_1c != 2) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                 ,0x6a23);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    BufferTestBase::getShaderSource_abi_cxx11_(&local_98,&this->super_BufferTestBase,2,local_20);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string XFBCaptureStructTest::getShaderSource(GLuint test_case_index, Utils::Shader::STAGES stage)
{
	std::string source;

	switch (test_case_index)
	{
	case TEST_VS:
		switch (stage)
		{
		case Utils::Shader::FRAGMENT:
		case Utils::Shader::VERTEX:
			source = BufferTestBase::getShaderSource(test_case_index, stage);
			break;
		default:
			break;
		}
		break;

	case TEST_TES:
		switch (stage)
		{
		case Utils::Shader::FRAGMENT:
		case Utils::Shader::TESS_CTRL:
		case Utils::Shader::TESS_EVAL:
		case Utils::Shader::VERTEX:
			source = BufferTestBase::getShaderSource(test_case_index, stage);
			break;
		default:
			break;
		}
		break;

	case TEST_GS:
		source = BufferTestBase::getShaderSource(test_case_index, stage);
		break;

	default:
		TCU_FAIL("Invalid enum");
		break;
	}

	/* */
	return source;
}